

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

ArgumentSyntax * __thiscall slang::parsing::Parser::parseArgument(Parser *this)

{
  bool bVar1;
  EmptyArgumentSyntax *pEVar2;
  OrderedArgumentSyntax *pOVar3;
  SourceLocation location;
  PropertyExprSyntax *pPVar4;
  NamedArgumentSyntax *pNVar5;
  Token TVar6;
  Token name;
  Token closeParen;
  Token start;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
  if (!bVar1) {
    bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis);
    if (!bVar1) {
      bVar1 = ParserBase::peek(&this->super_ParserBase,Dot);
      if (bVar1) {
        TVar6 = ParserBase::consume(&this->super_ParserBase);
        name = ParserBase::expect(&this->super_ParserBase,Identifier);
        start = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
        if ((start._0_4_ >> 0x10 & 1) == 0) {
          bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis);
          if (bVar1) {
            pPVar4 = (PropertyExprSyntax *)0x0;
          }
          else {
            pPVar4 = parsePropertyExpr(this,0);
          }
          closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
        }
        else {
          location = Token::location(&start);
          closeParen = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,location);
          pPVar4 = (PropertyExprSyntax *)0x0;
        }
        pNVar5 = syntax::SyntaxFactory::namedArgument
                           (&this->factory,TVar6,name,start,pPVar4,closeParen);
        return &pNVar5->super_ArgumentSyntax;
      }
      pPVar4 = parsePropertyExpr(this,0);
      pOVar3 = syntax::SyntaxFactory::orderedArgument(&this->factory,pPVar4);
      return &pOVar3->super_ArgumentSyntax;
    }
  }
  TVar6 = ParserBase::placeholderToken(&this->super_ParserBase);
  pEVar2 = syntax::SyntaxFactory::emptyArgument(&this->factory,TVar6);
  return &pEVar2->super_ArgumentSyntax;
}

Assistant:

ArgumentSyntax& Parser::parseArgument() {
    // check for empty arguments
    if (peek(TokenKind::Comma) || peek(TokenKind::CloseParenthesis))
        return factory.emptyArgument(placeholderToken());

    // check for named arguments
    if (peek(TokenKind::Dot)) {
        auto dot = consume();
        auto name = expect(TokenKind::Identifier);

        auto [innerOpenParen, innerCloseParen,
              expr] = parseGroupOrSkip(TokenKind::OpenParenthesis, TokenKind::CloseParenthesis,
                                       [this]() { return &parsePropertyExpr(0); });

        return factory.namedArgument(dot, name, innerOpenParen, expr, innerCloseParen);
    }

    return factory.orderedArgument(parsePropertyExpr(0));
}